

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::ParseCertificatePoliciesExtensionOidsTest_OnePolicy_Test::TestBody
          (ParseCertificatePoliciesExtensionOidsTest_OnePolicy_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference rhs;
  CertErrors *in_R9;
  string_view s;
  Input extension_value;
  AssertHelper local_1c8;
  Message local_1c0;
  Span<const_unsigned_char> local_1b8;
  Input local_1a8;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  Message local_180;
  size_type local_178;
  uint local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  AssertHelper local_138;
  Message local_130;
  undefined1 local_128 [16];
  Span<const_unsigned_char> local_118;
  Input local_108;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__1;
  CertErrors errors;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> policies;
  string local_a8;
  AssertHelper local_88;
  Message local_80 [3];
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  string der;
  ParseCertificatePoliciesExtensionOidsTest_OnePolicy_Test *this_local;
  
  ::std::__cxx11::string::string((string *)&gtest_ar_.message_);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"policy_1_2_3.pem",&local_61);
  LoadTestData((anon_unknown_0 *)local_40,&local_60,(string *)&gtest_ar_.message_);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::allocator<char>::~allocator(&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_40,
               (AssertionResult *)"LoadTestData(\"policy_1_2_3.pem\", &der)","false","true",
               (char *)in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    ::std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (bVar1) {
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::vector
              ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
               &errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    CertErrors::CertErrors((CertErrors *)&gtest_ar__1.message_);
    local_128 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&gtest_ar_.message_);
    s._M_str = local_128._8_8_;
    s._M_len = (size_t)s._M_str;
    local_118 = StringAsBytes(local_128._0_8_,s);
    bssl::der::Input::Input(&local_108,local_118);
    bVar1 = ParseCertificatePoliciesExtensionOidsTest::fail_parsing_unknown_qualifier_oids
                      (&this->super_ParseCertificatePoliciesExtensionOidsTest);
    extension_value.data_.size_._0_1_ = bVar1;
    extension_value.data_.data_ = (uchar *)local_108.data_.size_;
    extension_value.data_.size_._1_7_ = 0;
    local_f1 = ParseCertificatePoliciesExtensionOids
                         ((bssl *)local_108.data_.data_,extension_value,
                          (bool)((char)&errors + '\x10'),
                          (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                          &gtest_ar__1.message_,in_R9);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_f0,&local_f1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_f0,
                 (AssertionResult *)
                 "ParseCertificatePoliciesExtensionOids( StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies, &errors)"
                 ,"false","true",(char *)in_R9);
      pcVar2 = (char *)::std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x74,pcVar2);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      ::std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_130);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    local_16c = 1;
    local_178 = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::size
                          ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                           &errors.nodes_.
                            super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_168,"1U","policies.size()",&local_16c,&local_178);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x75,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_180);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_180);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
    if (bVar1) {
      Span<unsigned_char_const>::Span<2ul>
                ((Span<unsigned_char_const> *)&local_1b8,
                 (uchar (*) [2])&(anonymous_namespace)::policy_1_2_3_der);
      bssl::der::Input::Input(&local_1a8,local_1b8);
      rhs = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::operator[]
                      ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                       &errors.nodes_.
                        super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      testing::internal::EqHelper::Compare<bssl::der::Input,_bssl::der::Input,_nullptr>
                ((EqHelper *)local_198,"der::Input(policy_1_2_3_der)","policies[0]",&local_1a8,rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
      if (!bVar1) {
        testing::Message::Message(&local_1c0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                   ,0x76,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
        testing::internal::AssertHelper::~AssertHelper(&local_1c8);
        testing::Message::~Message(&local_1c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
    }
    CertErrors::~CertErrors((CertErrors *)&gtest_ar__1.message_);
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~vector
              ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
               &errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  ::std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest, OnePolicy) {
  std::string der;
  ASSERT_TRUE(LoadTestData("policy_1_2_3.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_TRUE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
  ASSERT_EQ(1U, policies.size());
  EXPECT_EQ(der::Input(policy_1_2_3_der), policies[0]);
}